

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# backward_references_inc.h
# Opt level: O3

void CreateBackwardReferencesNH4
               (size_t num_bytes,size_t position,uint8_t *ringbuffer,size_t ringbuffer_mask,
               BrotliEncoderParams *params,HasherHandle hasher,int *dist_cache,
               size_t *last_insert_len,Command *commands,size_t *num_commands,size_t *num_literals)

{
  ulong uVar1;
  int *piVar2;
  long lVar3;
  ulong uVar4;
  ushort uVar5;
  BrotliDictionary *pBVar6;
  int iVar7;
  int iVar8;
  size_t sVar9;
  uint8_t uVar10;
  ushort uVar11;
  uint uVar12;
  uint32_t uVar13;
  uint uVar14;
  int *piVar15;
  uint8_t *puVar16;
  ulong uVar17;
  byte bVar18;
  int iVar19;
  ulong uVar20;
  ulong uVar21;
  int iVar22;
  ulong uVar23;
  ulong uVar24;
  ulong uVar25;
  size_t sVar26;
  long lVar27;
  ulong uVar28;
  uint uVar29;
  ulong uVar30;
  long lVar31;
  long lVar32;
  ulong uVar33;
  uint *puVar34;
  int iVar35;
  ulong uVar36;
  uint uVar37;
  ulong uVar38;
  ulong uVar39;
  ulong uVar40;
  ulong uVar41;
  ulong uVar42;
  size_t local_120;
  ulong local_118;
  ulong local_108;
  ulong local_f8;
  ulong local_f0;
  ulong local_e8;
  Command *local_d8;
  long local_c0;
  ulong local_90;
  uint local_70;
  
  uVar4 = (position - 7) + num_bytes;
  sVar26 = position;
  if (7 < num_bytes) {
    sVar26 = uVar4;
  }
  lVar27 = 0x200;
  if (params->quality < 9) {
    lVar27 = 0x40;
  }
  local_120 = *last_insert_len;
  uVar1 = position + num_bytes;
  if (uVar1 <= position + 8) {
    local_d8 = commands;
LAB_00103e33:
    *last_insert_len = (local_120 + uVar1) - position;
    *num_commands = *num_commands + ((long)local_d8 - (long)commands >> 4);
    return;
  }
  uVar25 = (1L << ((byte)params->lgwin & 0x3f)) - 0x10;
  local_90 = lVar27 + position;
  lVar3 = position - 1;
  local_d8 = commands;
  uVar38 = position;
LAB_00102f82:
  local_118 = uVar1 - uVar38;
  uVar17 = uVar25;
  if (uVar38 < uVar25) {
    uVar17 = uVar38;
  }
  uVar23 = uVar38 & ringbuffer_mask;
  piVar2 = (int *)(ringbuffer + uVar23);
  local_e8 = (ulong)*dist_cache;
  local_f0 = 0x7e4;
  local_70 = (uint)ringbuffer_mask;
  uVar10 = (uint8_t)*(long *)(ringbuffer + uVar23);
  if ((uVar38 - local_e8 < uVar38) &&
     (uVar28 = (ulong)((uint)(uVar38 - local_e8) & local_70), ringbuffer[uVar28] == uVar10)) {
    if (7 < local_118) {
      uVar30 = local_118 & 0xfffffffffffffff8;
      piVar15 = (int *)(ringbuffer + uVar30 + uVar23);
      lVar31 = 0;
      uVar24 = 0;
LAB_00103005:
      if (*(ulong *)(piVar2 + uVar24 * 2) == *(ulong *)(ringbuffer + uVar24 * 8 + uVar28))
      goto code_r0x00103016;
      uVar24 = *(ulong *)(ringbuffer + uVar24 * 8 + uVar28) ^ *(ulong *)(piVar2 + uVar24 * 2);
      uVar28 = 0;
      if (uVar24 != 0) {
        for (; (uVar24 >> uVar28 & 1) == 0; uVar28 = uVar28 + 1) {
        }
      }
      uVar24 = (uVar28 >> 3 & 0x1fffffff) - lVar31;
      goto LAB_00103243;
    }
    uVar30 = 0;
    piVar15 = piVar2;
LAB_00103dad:
    uVar33 = local_118 & 7;
    uVar24 = uVar30;
    if (uVar33 != 0) {
      uVar36 = uVar30 | uVar33;
      do {
        uVar24 = uVar30;
        if (ringbuffer[uVar30 + uVar28] != (uint8_t)*piVar15) break;
        piVar15 = (int *)((long)piVar15 + 1);
        uVar30 = uVar30 + 1;
        uVar33 = uVar33 - 1;
        uVar24 = uVar36;
      } while (uVar33 != 0);
    }
LAB_00103243:
    if ((uVar24 < 4) || (uVar28 = uVar24 * 0x87 + 0x78f, uVar28 < 0x7e5)) goto LAB_0010303e;
    uVar10 = *(uint8_t *)((long)piVar2 + uVar24);
    local_f0 = uVar28;
  }
  else {
LAB_0010303e:
    local_e8 = 0;
    uVar24 = 0;
  }
  uVar28 = (params->dist).max_distance;
  uVar30 = *(long *)(ringbuffer + uVar23) * -0x42e1ca5843000000;
  puVar34 = (uint *)(hasher + (uVar30 >> 0x2f) * 4 + 0x28);
  uVar33 = (ulong)((uint)local_118 & 7);
  iVar35 = 0;
  do {
    uVar37 = *puVar34;
    uVar12 = local_70 & uVar37;
    if (((uVar10 == ringbuffer[uVar24 + uVar12]) && (uVar38 != uVar37)) &&
       (uVar36 = uVar38 - uVar37, uVar36 <= uVar17)) {
      if (7 < local_118) {
        lVar31 = 0;
        uVar40 = 0;
LAB_001030ea:
        if (*(ulong *)(piVar2 + uVar40 * 2) == *(ulong *)(ringbuffer + uVar40 * 8 + (ulong)uVar12))
        goto code_r0x001030f7;
        uVar39 = *(ulong *)(ringbuffer + uVar40 * 8 + (ulong)uVar12) ^
                 *(ulong *)(piVar2 + uVar40 * 2);
        uVar40 = 0;
        if (uVar39 != 0) {
          for (; (uVar39 >> uVar40 & 1) == 0; uVar40 = uVar40 + 1) {
          }
        }
        uVar40 = (uVar40 >> 3 & 0x1fffffff) - lVar31;
        goto LAB_00103129;
      }
      piVar15 = piVar2;
      uVar39 = 0;
LAB_00103175:
      uVar40 = uVar39;
      if (uVar33 != 0) {
        uVar41 = uVar33 | uVar39;
        uVar42 = uVar33;
        do {
          uVar40 = uVar39;
          if (ringbuffer[uVar39 + uVar12] != (uint8_t)*piVar15) break;
          piVar15 = (int *)((long)piVar15 + 1);
          uVar39 = uVar39 + 1;
          uVar42 = uVar42 - 1;
          uVar40 = uVar41;
        } while (uVar42 != 0);
      }
LAB_00103129:
      if (3 < uVar40) {
        iVar7 = 0x1f;
        if ((uint)uVar36 != 0) {
          for (; (uint)uVar36 >> iVar7 == 0; iVar7 = iVar7 + -1) {
          }
        }
        uVar39 = (ulong)(iVar7 * -0x1e + 0x780) + uVar40 * 0x87;
        if (local_f0 < uVar39) {
          uVar10 = *(uint8_t *)((long)piVar2 + uVar40);
          uVar24 = uVar40;
          local_f0 = uVar39;
          local_e8 = uVar36;
        }
      }
    }
    puVar34 = puVar34 + 1;
    iVar35 = iVar35 + 1;
  } while (iVar35 != 4);
  iVar35 = 0;
  uVar37 = (uint)(uVar30 >> 0x20);
  if (local_f0 == 0x7e4) {
    if (*(ulong *)(hasher + 0x18) >> 7 <= *(ulong *)(hasher + 0x20)) {
      uVar5 = (params->dictionary).hash_table[(ulong)((uint)(*piVar2 * 0x1e35a7bd) >> 0x12) * 2];
      *(ulong *)(hasher + 0x18) = *(ulong *)(hasher + 0x18) + 1;
      if ((ulong)uVar5 == 0) goto LAB_00103209;
      uVar12 = uVar5 & 0x1f;
      uVar23 = (ulong)uVar12;
      if (local_118 < uVar23) goto LAB_00103209;
      pBVar6 = (params->dictionary).words;
      puVar16 = pBVar6->data + (ulong)pBVar6->offsets_by_length[uVar23] + uVar23 * (uVar5 >> 5);
      if (7 < uVar23) {
        local_f8 = (ulong)(uVar5 & 0x18);
        lVar31 = 0;
        uVar24 = 0;
LAB_001032bc:
        if (*(ulong *)(puVar16 + uVar24 * 8) == *(ulong *)(piVar2 + uVar24 * 2))
        goto code_r0x001032c9;
        uVar30 = *(ulong *)(piVar2 + uVar24 * 2) ^ *(ulong *)(puVar16 + uVar24 * 8);
        uVar24 = 0;
        if (uVar30 != 0) {
          for (; (uVar30 >> uVar24 & 1) == 0; uVar24 = uVar24 + 1) {
          }
        }
        uVar24 = (uVar24 >> 3 & 0x1fffffff) - lVar31;
        goto LAB_00103305;
      }
      local_f8 = 0;
      goto LAB_00103def;
    }
    goto LAB_00103209;
  }
  goto LAB_00103399;
code_r0x00103016:
  uVar24 = uVar24 + 1;
  lVar31 = lVar31 + -8;
  if (local_118 >> 3 == uVar24) goto LAB_00103dad;
  goto LAB_00103005;
code_r0x001030f7:
  uVar40 = uVar40 + 1;
  lVar31 = lVar31 + -8;
  piVar15 = (int *)(ringbuffer + (local_118 & 0xfffffffffffffff8) + uVar23);
  uVar39 = local_118 & 0xfffffffffffffff8;
  if (local_118 >> 3 == uVar40) goto LAB_00103175;
  goto LAB_001030ea;
code_r0x001032c9:
  uVar24 = uVar24 + 1;
  lVar31 = lVar31 + -8;
  if (uVar12 >> 3 == uVar24) goto code_r0x001032d5;
  goto LAB_001032bc;
code_r0x001032d5:
  puVar16 = puVar16 + -lVar31;
LAB_00103def:
  uVar30 = (ulong)uVar5 & 7;
  uVar24 = local_f8;
  if ((uVar5 & 7) != 0) {
    uVar33 = local_f8 | uVar30;
    do {
      uVar24 = local_f8;
      if (*(uint8_t *)((long)piVar2 + local_f8) != *puVar16) break;
      puVar16 = puVar16 + 1;
      local_f8 = local_f8 + 1;
      uVar30 = uVar30 - 1;
      uVar24 = uVar33;
    } while (uVar30 != 0);
  }
LAB_00103305:
  if (((uVar24 == 0) || ((params->dictionary).cutoffTransformsCount + uVar24 <= uVar23)) ||
     (local_e8 = uVar17 + 1 + (ulong)(uVar5 >> 5) +
                 ((ulong)((uint)((params->dictionary).cutoffTransforms >>
                                ((char)(uVar23 - uVar24) * '\x06' & 0x3fU)) & 0x3f) +
                  (uVar23 - uVar24) * 4 << (pBVar6->size_bits_by_length[uVar23] & 0x3f)),
     uVar28 < local_e8)) {
LAB_00103209:
    *(int *)(hasher + (ulong)((uVar37 >> 0xf) + ((uint)(uVar38 >> 3) & 3)) * 4 + 0x28) = (int)uVar38
    ;
  }
  else {
    iVar35 = 0x1f;
    if ((uint)local_e8 != 0) {
      for (; (uint)local_e8 >> iVar35 == 0; iVar35 = iVar35 + -1) {
      }
    }
    local_f0 = (uVar24 * 0x87 - (ulong)(uint)(iVar35 * 0x1e)) + 0x780;
    if (local_f0 < 0x7e4) goto LAB_00103209;
    iVar35 = uVar12 - (int)uVar24;
    *(ulong *)(hasher + 0x20) = *(ulong *)(hasher + 0x20) + 1;
LAB_00103399:
    *(int *)(hasher + (ulong)((uVar37 >> 0xf) + ((uint)(uVar38 >> 3) & 3)) * 4 + 0x28) = (int)uVar38
    ;
    if (0x7e4 < local_f0) {
      iVar7 = *dist_cache;
      uVar17 = local_120 + 4;
      uVar23 = (lVar3 + num_bytes) - uVar38;
      iVar19 = 0;
LAB_001033f7:
      local_118 = local_118 - 1;
      uVar30 = uVar24 - 1;
      if (local_118 <= uVar24 - 1) {
        uVar30 = local_118;
      }
      if (4 < params->quality) {
        uVar30 = 0;
      }
      uVar33 = uVar38 + 1;
      uVar36 = uVar25;
      if (uVar33 < uVar25) {
        uVar36 = uVar33;
      }
      piVar2 = (int *)(ringbuffer + (uVar33 & ringbuffer_mask));
      uVar10 = *(uint8_t *)(uVar30 + (long)piVar2);
      uVar39 = uVar33 - (long)iVar7;
      uVar40 = 0x7e4;
      if ((uVar39 < uVar33) &&
         (uVar37 = (uint)uVar39 & local_70, uVar10 == ringbuffer[uVar30 + uVar37])) {
        if (7 < local_118) {
          lVar31 = 0;
          uVar39 = 0;
LAB_0010348e:
          if (*(ulong *)(piVar2 + uVar39 * 2) == *(ulong *)(ringbuffer + uVar39 * 8 + (ulong)uVar37)
             ) goto code_r0x0010349b;
          uVar42 = *(ulong *)(ringbuffer + uVar39 * 8 + (ulong)uVar37) ^
                   *(ulong *)(piVar2 + uVar39 * 2);
          uVar39 = 0;
          if (uVar42 != 0) {
            for (; (uVar42 >> uVar39 & 1) == 0; uVar39 = uVar39 + 1) {
            }
          }
          uVar39 = (uVar39 >> 3 & 0x1fffffff) - lVar31;
          goto LAB_001034c7;
        }
        uVar39 = 0;
        piVar15 = piVar2;
        goto LAB_00103876;
      }
      goto LAB_00103508;
    }
  }
  local_120 = local_120 + 1;
  position = uVar38 + 1;
  if (local_90 < position) {
    if ((uint)((int)lVar27 * 4) + local_90 < position) {
      uVar17 = uVar38 + 0x11;
      if (uVar4 <= uVar38 + 0x11) {
        uVar17 = uVar4;
      }
      for (; position < uVar17; position = position + 4) {
        *(int *)(hasher + (ulong)((uint)((ulong)(*(long *)(ringbuffer + (position & ringbuffer_mask)
                                                          ) * -0x42e1ca5843000000) >> 0x2f) +
                                 ((uint)(position >> 3) & 3)) * 4 + 0x28) = (int)position;
        local_120 = local_120 + 4;
      }
    }
    else {
      uVar17 = uVar38 + 9;
      if (uVar4 <= uVar38 + 9) {
        uVar17 = uVar4;
      }
      for (; position < uVar17; position = position + 2) {
        *(int *)(hasher + (ulong)((uint)((ulong)(*(long *)(ringbuffer + (position & ringbuffer_mask)
                                                          ) * -0x42e1ca5843000000) >> 0x2f) +
                                 ((uint)(position >> 3) & 3)) * 4 + 0x28) = (int)position;
        local_120 = local_120 + 2;
      }
    }
  }
  goto LAB_00103d37;
code_r0x0010349b:
  uVar39 = uVar39 + 1;
  lVar31 = lVar31 + -8;
  if (uVar23 >> 3 == uVar39) goto code_r0x001034a9;
  goto LAB_0010348e;
code_r0x001034a9:
  uVar39 = -lVar31;
  piVar15 = (int *)((long)piVar2 - lVar31);
LAB_00103876:
  uVar42 = local_118 & 7;
  for (; (uVar42 != 0 && (ringbuffer[uVar39 + uVar37] == (uint8_t)*piVar15)); uVar39 = uVar39 + 1) {
    piVar15 = (int *)((long)piVar15 + 1);
    uVar42 = uVar42 - 1;
  }
LAB_001034c7:
  if (uVar39 < 4) {
LAB_00103508:
    local_108 = 0;
  }
  else {
    uVar42 = uVar39 * 0x87 + 0x78f;
    if (uVar42 < 0x7e5) {
      local_108 = 0;
    }
    else {
      uVar10 = *(uint8_t *)((long)piVar2 + uVar39);
      uVar40 = uVar42;
      uVar30 = uVar39;
      local_108 = (long)iVar7;
    }
  }
  lVar31 = *(long *)(ringbuffer + (uVar33 & ringbuffer_mask));
  puVar34 = (uint *)(hasher + ((ulong)(lVar31 * -0x42e1ca5843000000) >> 0x2f) * 4 + 0x28);
  uVar39 = (ulong)((uint)local_118 & 7);
  iVar22 = 0;
LAB_00103548:
  uVar37 = *puVar34;
  uVar12 = local_70 & uVar37;
  if (((uVar10 == ringbuffer[uVar30 + uVar12]) && (uVar33 != uVar37)) &&
     (uVar42 = uVar33 - uVar37, uVar42 <= uVar36)) {
    uVar41 = uVar39;
    if (7 < local_118) {
      lVar32 = 0;
      uVar20 = 0;
LAB_0010358a:
      if (*(ulong *)(piVar2 + uVar20 * 2) == *(ulong *)(ringbuffer + uVar20 * 8 + (ulong)uVar12))
      goto code_r0x00103597;
      uVar20 = *(ulong *)(ringbuffer + uVar20 * 8 + (ulong)uVar12) ^ *(ulong *)(piVar2 + uVar20 * 2)
      ;
      uVar41 = 0;
      if (uVar20 != 0) {
        for (; (uVar20 >> uVar41 & 1) == 0; uVar41 = uVar41 + 1) {
        }
      }
      uVar20 = (uVar41 >> 3 & 0x1fffffff) - lVar32;
      goto LAB_001035c1;
    }
    uVar20 = 0;
    piVar15 = piVar2;
    goto joined_r0x0010361c;
  }
  goto LAB_001035fd;
code_r0x00103597:
  uVar20 = uVar20 + 1;
  lVar32 = lVar32 + -8;
  if (uVar23 >> 3 == uVar20) goto code_r0x001035a5;
  goto LAB_0010358a;
code_r0x001035a5:
  uVar20 = -lVar32;
  piVar15 = (int *)((long)piVar2 - lVar32);
joined_r0x0010361c:
  for (; (uVar41 != 0 && (ringbuffer[uVar20 + uVar12] == (uint8_t)*piVar15)); uVar20 = uVar20 + 1) {
    uVar41 = uVar41 - 1;
    piVar15 = (int *)((long)piVar15 + 1);
  }
LAB_001035c1:
  if (3 < uVar20) {
    iVar8 = 0x1f;
    if ((uint)uVar42 != 0) {
      for (; (uint)uVar42 >> iVar8 == 0; iVar8 = iVar8 + -1) {
      }
    }
    uVar41 = (ulong)(iVar8 * -0x1e + 0x780) + uVar20 * 0x87;
    if (uVar40 < uVar41) {
      uVar10 = *(uint8_t *)((long)piVar2 + uVar20);
      uVar40 = uVar41;
      uVar30 = uVar20;
      local_108 = uVar42;
    }
  }
LAB_001035fd:
  puVar34 = puVar34 + 1;
  iVar22 = iVar22 + 1;
  if (iVar22 == 4) goto LAB_00103634;
  goto LAB_00103548;
LAB_00103634:
  iVar22 = 0;
  if (uVar40 != 0x7e4) goto LAB_00103696;
  uVar40 = 0x7e4;
  if (*(ulong *)(hasher + 0x20) < *(ulong *)(hasher + 0x18) >> 7) goto LAB_00103696;
  uVar5 = (params->dictionary).hash_table[(ulong)((uint)(*piVar2 * 0x1e35a7bd) >> 0x12) * 2];
  *(ulong *)(hasher + 0x18) = *(ulong *)(hasher + 0x18) + 1;
  if ((ulong)uVar5 == 0) goto LAB_00103696;
  uVar37 = uVar5 & 0x1f;
  uVar39 = (ulong)uVar37;
  if (local_118 < uVar39) goto LAB_00103696;
  pBVar6 = (params->dictionary).words;
  puVar16 = pBVar6->data + (ulong)pBVar6->offsets_by_length[uVar39] + uVar39 * (uVar5 >> 5);
  if (7 < uVar39) {
    uVar42 = (ulong)(uVar5 & 0x18);
    local_c0 = 0;
    uVar41 = 0;
LAB_00103775:
    if (*(ulong *)(puVar16 + uVar41 * 8) == *(ulong *)(piVar2 + uVar41 * 2)) goto code_r0x00103782;
    uVar41 = *(ulong *)(piVar2 + uVar41 * 2) ^ *(ulong *)(puVar16 + uVar41 * 8);
    uVar42 = 0;
    if (uVar41 != 0) {
      for (; (uVar41 >> uVar42 & 1) == 0; uVar42 = uVar42 + 1) {
      }
    }
    uVar41 = (uVar42 >> 3 & 0x1fffffff) - local_c0;
    goto LAB_001037ba;
  }
  uVar42 = 0;
  goto LAB_001038a5;
code_r0x00103782:
  uVar41 = uVar41 + 1;
  local_c0 = local_c0 + -8;
  if (uVar37 >> 3 == uVar41) goto code_r0x00103790;
  goto LAB_00103775;
code_r0x00103790:
  puVar16 = puVar16 + -local_c0;
LAB_001038a5:
  uVar20 = (ulong)uVar5 & 7;
  uVar41 = uVar42;
  if ((uVar5 & 7) != 0) {
    uVar21 = uVar42 | uVar20;
    do {
      uVar41 = uVar42;
      if (*(uint8_t *)((long)piVar2 + uVar42) != *puVar16) break;
      puVar16 = puVar16 + 1;
      uVar42 = uVar42 + 1;
      uVar20 = uVar20 - 1;
      uVar41 = uVar21;
    } while (uVar20 != 0);
  }
LAB_001037ba:
  iVar22 = 0;
  if (((uVar41 != 0) && (uVar39 < (params->dictionary).cutoffTransformsCount + uVar41)) &&
     (uVar39 = uVar36 + 1 + (ulong)(uVar5 >> 5) +
               ((ulong)((uint)((params->dictionary).cutoffTransforms >>
                              ((char)(uVar39 - uVar41) * '\x06' & 0x3fU)) & 0x3f) +
                (uVar39 - uVar41) * 4 << (pBVar6->size_bits_by_length[uVar39] & 0x3f)),
     uVar39 <= uVar28)) {
    iVar8 = 0x1f;
    if ((uint)uVar39 != 0) {
      for (; (uint)uVar39 >> iVar8 == 0; iVar8 = iVar8 + -1) {
      }
    }
    uVar42 = (uVar41 * 0x87 - (ulong)(uint)(iVar8 * 0x1e)) + 0x780;
    if (0x7e3 < uVar42) {
      iVar22 = uVar37 - (int)uVar41;
      *(ulong *)(hasher + 0x20) = *(ulong *)(hasher + 0x20) + 1;
      uVar40 = uVar42;
      uVar30 = uVar41;
      local_108 = uVar39;
    }
  }
LAB_00103696:
  *(int *)(hasher + (ulong)((uint)((ulong)(lVar31 * -0x42e1ca5843000000) >> 0x2f) +
                           ((uint)(uVar33 >> 3) & 3)) * 4 + 0x28) = (int)uVar33;
  if (uVar40 < local_f0 + 0xaf) {
    uVar36 = uVar25;
    uVar30 = uVar24;
    uVar33 = uVar38;
    sVar9 = local_120;
    iVar22 = iVar35;
    if (uVar38 < uVar25) {
      uVar36 = uVar38;
    }
    goto LAB_00103a0b;
  }
  local_e8 = local_108;
  sVar9 = uVar17;
  if (iVar19 == 3) goto LAB_00103a0b;
  local_120 = local_120 + 1;
  iVar19 = iVar19 + 1;
  uVar39 = uVar38 + 9;
  uVar23 = uVar23 - 1;
  uVar24 = uVar30;
  uVar38 = uVar33;
  sVar9 = local_120;
  local_f0 = uVar40;
  iVar35 = iVar22;
  if (uVar1 <= uVar39) goto LAB_00103a0b;
  goto LAB_001033f7;
LAB_00103a0b:
  local_120 = sVar9;
  if (uVar36 < local_e8) {
LAB_00103a15:
    uVar38 = local_e8 + 0xf;
LAB_00103a19:
    if ((local_e8 <= uVar36) && (uVar38 != 0)) {
      dist_cache[3] = dist_cache[2];
      *(undefined8 *)(dist_cache + 1) = *(undefined8 *)dist_cache;
      *dist_cache = (int)local_e8;
    }
  }
  else {
    if (local_e8 != (long)*dist_cache) {
      uVar38 = 1;
      if (local_e8 != (long)dist_cache[1]) {
        uVar38 = (local_e8 + 3) - (long)*dist_cache;
        if (uVar38 < 7) {
          bVar18 = (byte)((int)uVar38 << 2);
          uVar37 = 0x9750468;
        }
        else {
          uVar38 = (local_e8 + 3) - (long)dist_cache[1];
          if (6 < uVar38) {
            uVar38 = 2;
            if ((local_e8 != (long)dist_cache[2]) && (uVar38 = 3, local_e8 != (long)dist_cache[3]))
            goto LAB_00103a15;
            goto LAB_00103a19;
          }
          bVar18 = (byte)((int)uVar38 << 2);
          uVar37 = 0xfdb1ace;
        }
        uVar38 = (ulong)(uVar37 >> (bVar18 & 0x1f) & 0xf);
      }
      goto LAB_00103a19;
    }
    uVar38 = 0;
  }
  uVar37 = (uint)local_120;
  local_d8->insert_len_ = uVar37;
  local_d8->copy_len_ = iVar22 << 0x19 | (uint)uVar30;
  uVar23 = (ulong)(params->dist).num_direct_distance_codes;
  uVar17 = uVar23 + 0x10;
  uVar13 = 0;
  if (uVar17 <= uVar38) {
    uVar12 = (params->dist).distance_postfix_bits;
    bVar18 = (byte)uVar12;
    uVar23 = ((4L << (bVar18 & 0x3f)) + (uVar38 - uVar23)) - 0x10;
    uVar29 = 0x1f;
    uVar14 = (uint)uVar23;
    if (uVar14 != 0) {
      for (; uVar14 >> uVar29 == 0; uVar29 = uVar29 - 1) {
      }
    }
    uVar29 = (uVar29 ^ 0xffffffe0) + 0x1f;
    uVar28 = (ulong)((uVar23 >> ((ulong)uVar29 & 0x3f) & 1) != 0);
    lVar31 = (ulong)uVar29 - (ulong)uVar12;
    uVar38 = (~(-1 << (bVar18 & 0x1f)) & uVar14) + uVar17 +
             (uVar28 + lVar31 * 2 + 0xfffe << (bVar18 & 0x3f)) | lVar31 * 0x400;
    uVar13 = (uint32_t)(uVar23 - (uVar28 + 2 << ((byte)uVar29 & 0x3f)) >> (bVar18 & 0x3f));
  }
  local_d8->dist_prefix_ = (uint16_t)uVar38;
  local_d8->dist_extra_ = uVar13;
  if (5 < local_120) {
    if (local_120 < 0x82) {
      uVar37 = 0x1f;
      uVar12 = (uint)(local_120 - 2);
      if (uVar12 != 0) {
        for (; uVar12 >> uVar37 == 0; uVar37 = uVar37 - 1) {
        }
      }
      uVar37 = (int)(local_120 - 2 >> ((char)(uVar37 ^ 0xffffffe0) + 0x1fU & 0x3f)) +
               (uVar37 ^ 0xffffffe0) * 2 + 0x40;
    }
    else if (local_120 < 0x842) {
      uVar12 = 0x1f;
      if (uVar37 - 0x42 != 0) {
        for (; uVar37 - 0x42 >> uVar12 == 0; uVar12 = uVar12 - 1) {
        }
      }
      uVar37 = (uVar12 ^ 0xffe0) + 0x2a;
    }
    else {
      uVar37 = 0x15;
      if (0x1841 < local_120) {
        uVar37 = (uint)(ushort)(0x17 - (local_120 < 0x5842));
      }
    }
  }
  uVar12 = iVar22 + (uint)uVar30;
  if (uVar12 < 10) {
    uVar29 = uVar12 - 2;
  }
  else if (uVar12 < 0x86) {
    uVar12 = uVar12 - 6;
    uVar29 = 0x1f;
    if (uVar12 != 0) {
      for (; uVar12 >> uVar29 == 0; uVar29 = uVar29 - 1) {
      }
    }
    uVar29 = (uVar12 >> ((char)(uVar29 ^ 0xffffffe0) + 0x1fU & 0x1f)) + (uVar29 ^ 0xffffffe0) * 2 +
             0x42;
  }
  else {
    uVar29 = 0x17;
    if (uVar12 < 0x846) {
      uVar29 = 0x1f;
      if (uVar12 - 0x46 != 0) {
        for (; uVar12 - 0x46 >> uVar29 == 0; uVar29 = uVar29 - 1) {
        }
      }
      uVar29 = (uVar29 ^ 0xffe0) + 0x2c;
    }
  }
  uVar5 = (ushort)uVar29;
  uVar11 = (uVar5 & 7) + ((ushort)uVar37 & 7) * 8;
  if ((((uVar38 & 0x3ff) == 0) && ((ushort)uVar37 < 8)) && (uVar5 < 0x10)) {
    if (7 < uVar5) {
      uVar11 = uVar11 | 0x40;
    }
  }
  else {
    iVar35 = ((uVar37 & 0xffff) >> 3) * 3 + ((uVar29 & 0xffff) >> 3);
    uVar11 = uVar11 + ((ushort)(0x520d40 >> ((char)iVar35 * '\x02' & 0x1fU)) & 0xc0) +
                      (short)iVar35 * 0x40 + 0x40;
  }
  local_d8->cmd_prefix_ = uVar11;
  *num_literals = *num_literals + local_120;
  position = uVar33 + uVar30;
  uVar38 = sVar26;
  if (position < sVar26) {
    uVar38 = position;
  }
  uVar17 = uVar33 + 2;
  if (local_e8 < uVar30 >> 2) {
    uVar23 = position + local_e8 * -4;
    if (uVar23 < uVar17) {
      uVar23 = uVar17;
    }
    uVar17 = uVar23;
    if (uVar38 < uVar23) {
      uVar17 = uVar38;
    }
  }
  local_90 = uVar33 + lVar27 + uVar30 * 2;
  local_d8 = local_d8 + 1;
  if (uVar17 < uVar38) {
    do {
      *(int *)(hasher + (ulong)((uint)((ulong)(*(long *)(ringbuffer + (uVar17 & ringbuffer_mask)) *
                                              -0x42e1ca5843000000) >> 0x2f) +
                               ((uint)(uVar17 >> 3) & 3)) * 4 + 0x28) = (int)uVar17;
      uVar17 = uVar17 + 1;
    } while (uVar38 != uVar17);
    local_120 = 0;
  }
  else {
    local_120 = 0;
  }
LAB_00103d37:
  uVar38 = position;
  if (uVar1 <= position + 8) goto LAB_00103e33;
  goto LAB_00102f82;
}

Assistant:

static BROTLI_NOINLINE void EXPORT_FN(CreateBackwardReferences)(
    size_t num_bytes, size_t position,
    const uint8_t* ringbuffer, size_t ringbuffer_mask,
    const BrotliEncoderParams* params, HasherHandle hasher, int* dist_cache,
    size_t* last_insert_len, Command* commands, size_t* num_commands,
    size_t* num_literals) {
  /* Set maximum distance, see section 9.1. of the spec. */
  const size_t max_backward_limit = BROTLI_MAX_BACKWARD_LIMIT(params->lgwin);

  const Command* const orig_commands = commands;
  size_t insert_length = *last_insert_len;
  const size_t pos_end = position + num_bytes;
  const size_t store_end = num_bytes >= FN(StoreLookahead)() ?
      position + num_bytes - FN(StoreLookahead)() + 1 : position;

  /* For speed up heuristics for random data. */
  const size_t random_heuristics_window_size =
      LiteralSpreeLengthForSparseSearch(params);
  size_t apply_random_heuristics = position + random_heuristics_window_size;
  const size_t gap = 0;

  /* Minimum score to accept a backward reference. */
  const score_t kMinScore = BROTLI_SCORE_BASE + 100;

  FN(PrepareDistanceCache)(hasher, dist_cache);

  while (position + FN(HashTypeLength)() < pos_end) {
    size_t max_length = pos_end - position;
    size_t max_distance = BROTLI_MIN(size_t, position, max_backward_limit);
    HasherSearchResult sr;
    sr.len = 0;
    sr.len_code_delta = 0;
    sr.distance = 0;
    sr.score = kMinScore;
    FN(FindLongestMatch)(hasher, &params->dictionary,
                         ringbuffer, ringbuffer_mask, dist_cache, position,
                         max_length, max_distance, gap,
                         params->dist.max_distance, &sr);
    if (sr.score > kMinScore) {
      /* Found a match. Let's look for something even better ahead. */
      int delayed_backward_references_in_row = 0;
      --max_length;
      for (;; --max_length) {
        const score_t cost_diff_lazy = 175;
        HasherSearchResult sr2;
        sr2.len = params->quality < MIN_QUALITY_FOR_EXTENSIVE_REFERENCE_SEARCH ?
            BROTLI_MIN(size_t, sr.len - 1, max_length) : 0;
        sr2.len_code_delta = 0;
        sr2.distance = 0;
        sr2.score = kMinScore;
        max_distance = BROTLI_MIN(size_t, position + 1, max_backward_limit);
        FN(FindLongestMatch)(hasher, &params->dictionary,
            ringbuffer, ringbuffer_mask, dist_cache, position + 1, max_length,
            max_distance, gap, params->dist.max_distance, &sr2);
        if (sr2.score >= sr.score + cost_diff_lazy) {
          /* Ok, let's just write one byte for now and start a match from the
             next byte. */
          ++position;
          ++insert_length;
          sr = sr2;
          if (++delayed_backward_references_in_row < 4 &&
              position + FN(HashTypeLength)() < pos_end) {
            continue;
          }
        }
        break;
      }
      apply_random_heuristics =
          position + 2 * sr.len + random_heuristics_window_size;
      max_distance = BROTLI_MIN(size_t, position, max_backward_limit);
      {
        /* The first 16 codes are special short-codes,
           and the minimum offset is 1. */
        size_t distance_code =
            ComputeDistanceCode(sr.distance, max_distance + gap, dist_cache);
        if ((sr.distance <= (max_distance + gap)) && distance_code > 0) {
          dist_cache[3] = dist_cache[2];
          dist_cache[2] = dist_cache[1];
          dist_cache[1] = dist_cache[0];
          dist_cache[0] = (int)sr.distance;
          FN(PrepareDistanceCache)(hasher, dist_cache);
        }
        InitCommand(commands++, &params->dist, insert_length,
            sr.len, sr.len_code_delta, distance_code);
      }
      *num_literals += insert_length;
      insert_length = 0;
      /* Put the hash keys into the table, if there are enough bytes left.
         Depending on the hasher implementation, it can push all positions
         in the given range or only a subset of them.
         Avoid hash poisoning with RLE data. */
      {
        size_t range_start = position + 2;
        size_t range_end = BROTLI_MIN(size_t, position + sr.len, store_end);
        if (sr.distance < (sr.len >> 2)) {
          range_start = BROTLI_MIN(size_t, range_end, BROTLI_MAX(size_t,
              range_start, position + sr.len - (sr.distance << 2)));
        }
        FN(StoreRange)(hasher, ringbuffer, ringbuffer_mask, range_start,
                       range_end);
      }
      position += sr.len;
    } else {
      ++insert_length;
      ++position;
      /* If we have not seen matches for a long time, we can skip some
         match lookups. Unsuccessful match lookups are very very expensive
         and this kind of a heuristic speeds up compression quite
         a lot. */
      if (position > apply_random_heuristics) {
        /* Going through uncompressible data, jump. */
        if (position >
            apply_random_heuristics + 4 * random_heuristics_window_size) {
          /* It is quite a long time since we saw a copy, so we assume
             that this data is not compressible, and store hashes less
             often. Hashes of non compressible data are less likely to
             turn out to be useful in the future, too, so we store less of
             them to not to flood out the hash table of good compressible
             data. */
          const size_t kMargin =
              BROTLI_MAX(size_t, FN(StoreLookahead)() - 1, 4);
          size_t pos_jump =
              BROTLI_MIN(size_t, position + 16, pos_end - kMargin);
          for (; position < pos_jump; position += 4) {
            FN(Store)(hasher, ringbuffer, ringbuffer_mask, position);
            insert_length += 4;
          }
        } else {
          const size_t kMargin =
              BROTLI_MAX(size_t, FN(StoreLookahead)() - 1, 2);
          size_t pos_jump =
              BROTLI_MIN(size_t, position + 8, pos_end - kMargin);
          for (; position < pos_jump; position += 2) {
            FN(Store)(hasher, ringbuffer, ringbuffer_mask, position);
            insert_length += 2;
          }
        }
      }
    }
  }
  insert_length += pos_end - position;
  *last_insert_len = insert_length;
  *num_commands += (size_t)(commands - orig_commands);
}